

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

bool __thiscall
duckdb::RowGroupCollection::Scan
          (RowGroupCollection *this,DuckTransaction *transaction,
          function<bool_(duckdb::DataChunk_&)> *fun)

{
  bool bVar1;
  ulong local_50;
  vector<duckdb::StorageIndex,_true> column_ids;
  
  column_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  column_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  column_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::reserve
            (&column_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>,
             ((long)(this->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x18);
  for (local_50 = 0;
      local_50 <
      (ulong)(((long)(this->types).
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0x18); local_50 = local_50 + 1) {
    ::std::vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>>::
    emplace_back<unsigned_long&>
              ((vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>> *)&column_ids,
               &local_50);
  }
  bVar1 = Scan(this,transaction,&column_ids,fun);
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector
            (&column_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>);
  return bVar1;
}

Assistant:

bool RowGroupCollection::Scan(DuckTransaction &transaction, const std::function<bool(DataChunk &chunk)> &fun) {
	vector<StorageIndex> column_ids;
	column_ids.reserve(types.size());
	for (idx_t i = 0; i < types.size(); i++) {
		column_ids.emplace_back(i);
	}
	return Scan(transaction, column_ids, fun);
}